

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock.cc
# Opt level: O0

Time absl::lts_20250127::Now(void)

{
  Duration DVar1;
  int64_t n_00;
  Duration DVar2;
  Time TVar3;
  Duration d;
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_80;
  undefined8 local_60;
  undefined4 local_58;
  undefined8 local_40;
  int64_t n;
  undefined4 local_c;
  
  n_00 = GetCurrentTimeNanos();
  if (n_00 < 0) {
    DVar2 = Nanoseconds<long,_0>(n_00);
    local_80 = DVar2.rep_hi_;
    DVar2.rep_hi_.hi_ = 0;
    DVar2.rep_hi_.lo_ = DVar2.rep_lo_;
    TVar3 = time_internal::FromUnixDuration((time_internal *)local_80,DVar2);
    local_a0 = TVar3.rep_.rep_hi_;
    stack0xffffffffffffffec = local_a0;
    local_98 = TVar3.rep_.rep_lo_;
    local_c = local_98;
  }
  else {
    DVar2 = time_internal::MakeDuration(n_00 / 1000000000,(n_00 % 1000000000) * 4);
    d.rep_lo_ = DVar2.rep_lo_;
    local_40 = DVar2.rep_hi_;
    d.rep_hi_.hi_ = 0;
    d.rep_hi_.lo_ = d.rep_lo_;
    TVar3 = time_internal::FromUnixDuration((time_internal *)local_40,d);
    local_60 = TVar3.rep_.rep_hi_;
    stack0xffffffffffffffec = local_60;
    local_58 = TVar3.rep_.rep_lo_;
    local_c = local_58;
  }
  DVar1.rep_lo_ = local_c;
  DVar1.rep_hi_ = stack0xffffffffffffffec;
  return (Time)DVar1;
}

Assistant:

ABSL_NAMESPACE_BEGIN
Time Now() {
  // TODO(bww): Get a timespec instead so we don't have to divide.
  int64_t n = absl::GetCurrentTimeNanos();
  if (n >= 0) {
    return time_internal::FromUnixDuration(
        time_internal::MakeDuration(n / 1000000000, n % 1000000000 * 4));
  }
  return time_internal::FromUnixDuration(absl::Nanoseconds(n));
}